

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O3

void __thiscall FIX::DataDictionary::addHeaderField(DataDictionary *this,int field,bool required)

{
  iterator __position;
  mapped_type *pmVar1;
  int local_14;
  
  if (this->m_storeMsgFieldsOrder == true) {
    __position._M_current =
         (this->m_headerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_headerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->m_headerOrderedFields,__position,
                 &local_14);
    }
    else {
      *__position._M_current = field;
      (this->m_headerOrderedFields).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->m_headerFields,&local_14);
  *pmVar1 = required;
  return;
}

Assistant:

void addHeaderField( int field, bool required )
  {
    if (m_storeMsgFieldsOrder)
    {
      m_headerOrderedFields.push_back(field);
    }

    m_headerFields[ field ] = required;
  }